

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latex_nivalis_conv.cpp
# Opt level: O0

string * nivalis::nivalis_to_latex(string *expr_in,Environment *env)

{
  int iVar1;
  ulong uVar2;
  char *pcVar3;
  long lVar4;
  string *in_RSI;
  string *in_RDI;
  ostringstream strm;
  Expr expr;
  string copy;
  string *s;
  ostream *os;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd88;
  undefined4 in_stack_fffffffffffffd8c;
  string *this;
  char *in_stack_fffffffffffffdb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdc0;
  ostringstream local_220 [96];
  size_t in_stack_fffffffffffffe40;
  undefined1 in_stack_fffffffffffffe4e;
  undefined1 in_stack_fffffffffffffe4f;
  Environment *in_stack_fffffffffffffe50;
  string *in_stack_fffffffffffffe58;
  string *in_stack_fffffffffffffe70;
  string local_90 [32];
  string local_70 [36];
  undefined4 local_4c;
  allocator<char> local_45 [13];
  string local_38 [56];
  
  this = local_38;
  std::__cxx11::string::string(this,in_RSI);
  util::trim((string *)0x27ee60);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_38);
    if (*pcVar3 == '#') {
      std::__cxx11::string::substr((ulong)local_90,(ulong)local_38);
      std::operator+((char *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
                     in_stack_fffffffffffffd80);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
                     (char *)in_stack_fffffffffffffd80);
      std::__cxx11::string::~string(local_70);
      std::__cxx11::string::~string(local_90);
      local_4c = 1;
    }
    else {
      os = (ostream *)0x0;
      parse(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,(bool)in_stack_fffffffffffffe4f,
            (bool)in_stack_fffffffffffffe4e,in_stack_fffffffffffffe40,in_stack_fffffffffffffe70);
      std::__cxx11::ostringstream::ostringstream(local_220);
      Expr::latex_repr((Expr *)in_stack_fffffffffffffd80,os,(Environment *)0x27f050);
      std::__cxx11::ostringstream::str();
      uVar2 = std::__cxx11::string::size();
      if ((0xc < uVar2) &&
         (iVar1 = std::__cxx11::string::compare((ulong)in_RDI,0,(char *)0x6), iVar1 == 0)) {
        lVar4 = std::__cxx11::string::size();
        iVar1 = std::__cxx11::string::compare((ulong)in_RDI,lVar4 - 7,(char *)0x7);
        if (iVar1 == 0) {
          std::__cxx11::string::size();
          std::__cxx11::string::substr((ulong)&stack0xfffffffffffffdb8,(ulong)in_RDI);
          std::__cxx11::string::operator=((string *)in_RDI,(string *)&stack0xfffffffffffffdb8);
          std::__cxx11::string::~string((string *)&stack0xfffffffffffffdb8);
        }
      }
      local_4c = 1;
      std::__cxx11::ostringstream::~ostringstream(local_220);
      Expr::~Expr((Expr *)0x27f1a9);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,(allocator<char> *)this);
    std::allocator<char>::~allocator(local_45);
    local_4c = 1;
  }
  std::__cxx11::string::~string(local_38);
  return in_RDI;
}

Assistant:

std::string nivalis_to_latex(const std::string& expr_in, Environment& env) {
    std::string copy = expr_in;
    util::trim(copy);
    if (copy.empty()) return "";
    if (copy[0] == '#') return "\\text{" + copy.substr(1) + "}";
    Expr expr = parse(expr_in, env, false, true);

    std::ostringstream strm;
    expr.latex_repr(strm, env);
    std::string s = strm.str();
    if (s.size() >= 13 &&
            s.compare(0, 6, "\\left(") == 0 &&
            s.compare(s.size() - 7, 7, "\\right)") == 0) {
        s = s.substr(6, s.size() - 13);
    }
    return s;
}